

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  FILE *pFVar5;
  long lVar6;
  ulong uVar7;
  int i;
  ulong uVar8;
  long lVar9;
  int j;
  uint *puVar10;
  int (*paiVar11) [60];
  int (*paiVar12) [60];
  uint v;
  uint u;
  uint value;
  uint local_3c;
  uint local_38;
  undefined1 local_34 [4];
  
  pFVar5 = fopen(*(char **)ctx,"r");
  while (iVar3 = __isoc99_fscanf(pFVar5,"%u,%u,%u",&local_38,&local_3c,local_34), iVar3 != -1) {
    lVar6 = (long)inputNum;
    inputs[lVar6] = local_38;
    inputNum = inputNum + 2;
    inputs[lVar6 + 1] = local_3c;
  }
  puVar10 = ids;
  memcpy(ids,inputs,0x222e28);
  uVar4 = bucketSort(ids,ids + inputNum);
  uVar7 = 0;
  nodeNum = uVar4;
  uVar8 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar8 = uVar7;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    idHash[*puVar10] = (int)uVar7;
    puVar10 = puVar10 + 1;
  }
  lVar6 = (long)inputNum;
  paiVar11 = G;
  paiVar12 = Ginv;
  for (lVar9 = 0; lVar9 < lVar6; lVar9 = lVar9 + 2) {
    iVar3 = idHash[inputs[lVar9]];
    iVar1 = idHash[inputs[lVar9 + 1]];
    iVar2 = outDegrees[iVar3];
    outDegrees[iVar3] = iVar2 + 1;
    G[iVar3][iVar2] = iVar1;
    iVar2 = inDegrees[iVar1];
    inDegrees[iVar1] = iVar2 + 1;
    Ginv[iVar1][iVar2] = iVar3;
  }
  lVar6 = 0;
  for (lVar9 = 0; lVar9 < (int)uVar4; lVar9 = lVar9 + 1) {
    std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>
              (paiVar11,*paiVar11 + *(int *)((long)outDegrees + lVar6));
    std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>
              (paiVar12,*paiVar12 + *(int *)((long)inDegrees + lVar6));
    lVar6 = lVar6 + 4;
    paiVar12 = paiVar12 + 1;
    paiVar11 = paiVar11 + 1;
    uVar4 = nodeNum;
  }
  std::
  vector<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::resize(&pre,0x445c5);
  return extraout_EAX;
}

Assistant:

void run() {
    int path[16];
    for (int i = 0; i < nodeNum; ++i) {
        if (outDegrees[i] < 1 || inDegrees[i] < 1)continue;
        dfs_range1(i, i, 1);
        dfs_range2(i, i, 1);
        dfs(i, i, 1, path);
    }
}